

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynWhile * ParseWhile(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *condition;
  undefined4 extraout_var;
  SynBase *body;
  SynWhile *this;
  Lexeme *pLVar2;
  undefined4 extraout_var_00;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_while) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_153727::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'while\'")
    ;
    condition = ParseAssignment(ctx);
    if (condition == (SynBase *)0x0) {
      anon_unknown.dwarf_153727::Report
                (ctx,ctx->currentLexeme,"ERROR: expression expected after \'while(\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      condition = (SynBase *)CONCAT44(extraout_var,iVar1);
      SynError::SynError((SynError *)condition,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'while\' statement");
    body = ParseExpression(ctx);
    if (body == (SynBase *)0x0) {
      pLVar2 = ctx->currentLexeme;
      if (pLVar2->type == lex_semicolon) {
        ctx->currentLexeme = pLVar2 + 1;
      }
      else {
        anon_unknown.dwarf_153727::Report(ctx,pLVar2,"ERROR: body not found after \'while\' header")
        ;
      }
    }
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynWhile *)CONCAT44(extraout_var_00,iVar1);
    pLVar2 = ParseContext::Previous(ctx);
    SynWhile::SynWhile(this,begin,pLVar2,condition,body);
  }
  else {
    this = (SynWhile *)0x0;
  }
  return this;
}

Assistant:

SynWhile* ParseWhile(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_while))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'while'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'while('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'while' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body && !ctx.Consume(lex_semicolon))
			Report(ctx, ctx.Current(), "ERROR: body not found after 'while' header");

		return new (ctx.get<SynWhile>()) SynWhile(start, ctx.Previous(), condition, body);
	}

	return NULL;
}